

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall cmMakefile::LogUnused(cmMakefile *this,char *reason,string *name)

{
  bool bVar1;
  ostream *poVar2;
  string path;
  ostringstream msg;
  char *local_1d0;
  undefined8 local_1c8;
  char local_1c0 [16];
  string local_1b0;
  undefined1 local_190 [376];
  
  if (this->WarnUnused == true) {
    local_1d0 = local_1c0;
    local_1c8 = 0;
    local_1c0[0] = '\0';
    if ((this->ExecutionStatusStack).
        super__Vector_base<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (this->ExecutionStatusStack).
        super__Vector_base<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      GetCurrentSourceDirectory_abi_cxx11_(this);
      std::__cxx11::string::_M_assign((string *)&local_1d0);
      std::__cxx11::string::append((char *)&local_1d0);
    }
    else {
      GetExecutionContext((cmListFileContext *)local_190,this);
      std::__cxx11::string::operator=((string *)&local_1d0,(string *)(local_190 + 0x20));
      cmListFileContext::~cmListFileContext((cmListFileContext *)local_190);
    }
    if ((this->CheckSystemVars != false) || (bVar1 = IsProjectFile(this,local_1d0), bVar1)) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
      poVar2 = std::operator<<((ostream *)local_190,"unused variable (");
      poVar2 = std::operator<<(poVar2,reason);
      poVar2 = std::operator<<(poVar2,") \'");
      poVar2 = std::operator<<(poVar2,(string *)name);
      std::operator<<(poVar2,"\'");
      std::__cxx11::stringbuf::str();
      IssueMessage(this,AUTHOR_WARNING,&local_1b0);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
    }
    std::__cxx11::string::~string((string *)&local_1d0);
    return;
  }
  return;
}

Assistant:

void cmMakefile::LogUnused(const char* reason, const std::string& name) const
{
  if (this->WarnUnused) {
    std::string path;
    if (!this->ExecutionStatusStack.empty()) {
      path = this->GetExecutionContext().FilePath;
    } else {
      path = this->GetCurrentSourceDirectory();
      path += "/CMakeLists.txt";
    }

    if (this->CheckSystemVars || this->IsProjectFile(path.c_str())) {
      std::ostringstream msg;
      msg << "unused variable (" << reason << ") \'" << name << "\'";
      this->IssueMessage(MessageType::AUTHOR_WARNING, msg.str());
    }
  }
}